

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

asn_enc_rval_t *
OCTET_STRING_encode_xer
          (asn_TYPE_descriptor_t *td,void *sptr,int ilevel,xer_encoder_flags_e flags,
          asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  int in_ECX;
  long *in_RDX;
  char *pcVar4;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  uint in_R8D;
  code *in_R9;
  undefined8 in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  int tmp_i_1;
  int tmp_nl_1;
  int tmp_level_1;
  int tmp_i;
  int tmp_nl;
  int tmp_level;
  char *scend;
  size_t i;
  uint8_t *end;
  uint8_t *buf;
  char *p;
  char scratch [52];
  asn_enc_rval_t er;
  OCTET_STRING_t *st;
  char *h2c;
  char *local_e8;
  char *local_e0;
  int local_c8;
  int local_c0;
  int local_bc;
  int local_b4;
  ulong local_a8;
  byte *local_98;
  char *local_90;
  char local_88 [50];
  char acStack_56 [14];
  char *local_48;
  long *local_30;
  char *local_28;
  code *local_20;
  int local_14;
  long *local_10;
  asn_TYPE_descriptor_s *local_8;
  
  local_28 = "0123456789ABCDEF";
  local_90 = local_88;
  if ((in_RDX == (long *)0x0) || ((*in_RDX == 0 && ((int)in_RDX[1] != 0)))) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = in_RDX;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_e0 = "";
    }
    else {
      local_e0 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_e0);
    return in_RDI;
  }
  local_48 = (char *)0x0;
  local_98 = (byte *)*in_RDX;
  pbVar3 = local_98 + (int)in_RDX[1];
  local_20 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RSI;
  if ((in_R8D & 2) == 0) {
    local_a8 = 0;
    local_30 = in_RDX;
    local_14 = in_ECX;
    for (; local_98 < pbVar3; local_98 = local_98 + 1) {
      if (((local_a8 & 0xf) == 0) && ((local_a8 != 0 || (0x10 < (int)local_30[1])))) {
        iVar2 = (*local_20)(local_88,(long)local_90 - (long)local_88,in_stack_00000008);
        iVar1 = local_14;
        if (iVar2 < 0) goto LAB_001647d9;
        local_48 = local_90 + ((long)local_48 - (long)local_88);
        local_90 = local_88;
        local_b4 = local_14;
        iVar2 = (*local_20)("\n",1,in_stack_00000008);
        if (iVar2 < 0) goto LAB_001647d9;
        if (iVar1 < 0) {
          local_b4 = 0;
        }
        for (local_bc = 0; local_bc < local_b4; local_bc = local_bc + 1) {
          iVar1 = (*local_20)("    ",4,in_stack_00000008);
          if (iVar1 < 0) goto LAB_001647d9;
        }
        local_48 = local_48 + (local_b4 * 4 + 1);
      }
      *local_90 = "0123456789ABCDEF"[(int)(uint)*local_98 >> 4];
      pcVar4 = local_90 + 2;
      local_90[1] = "0123456789ABCDEF"[(int)(*local_98 & 0xf)];
      local_90 = local_90 + 3;
      *pcVar4 = ' ';
      local_a8 = local_a8 + 1;
    }
    if (local_90 != local_88) {
      iVar1 = (*local_20)(local_88,local_90 + (-1 - (long)local_88),in_stack_00000008);
      if (iVar1 < 0) {
LAB_001647d9:
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_8;
        in_RDI->structure_ptr = local_10;
        if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
          local_e8 = "";
        }
        else {
          local_e8 = local_8->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_e8);
        return in_RDI;
      }
      local_48 = local_90 + (long)(local_48 + (-1 - (long)local_88));
      if (0x10 < (int)local_30[1]) {
        local_c0 = local_14 + -1;
        iVar1 = (*local_20)("\n",1,in_stack_00000008);
        if (iVar1 < 0) goto LAB_001647d9;
        if (local_c0 < 0) {
          local_c0 = 0;
        }
        for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
          iVar1 = (*local_20)("    ",4,in_stack_00000008);
          if (iVar1 < 0) goto LAB_001647d9;
        }
        local_48 = local_48 + (local_c0 * 4 + 1);
      }
    }
  }
  else {
    for (; local_98 < pbVar3; local_98 = local_98 + 1) {
      if (acStack_56 <= local_90) {
        iVar1 = (*local_20)(local_88,(long)local_90 - (long)local_88,in_stack_00000008);
        if (iVar1 < 0) goto LAB_001647d9;
        local_48 = local_90 + ((long)local_48 - (long)local_88);
        local_90 = local_88;
      }
      pcVar4 = local_90 + 1;
      *local_90 = "0123456789ABCDEF"[(int)(uint)*local_98 >> 4];
      local_90 = local_90 + 2;
      *pcVar4 = "0123456789ABCDEF"[(int)(*local_98 & 0xf)];
    }
    iVar1 = (*local_20)(local_88,(long)local_90 - (long)local_88,in_stack_00000008);
    if (iVar1 < 0) goto LAB_001647d9;
    local_48 = local_90 + ((long)local_48 - (long)local_88);
  }
  in_RDI->encoded = (ssize_t)local_48;
  in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
  in_RDI->structure_ptr = (void *)0x0;
  return in_RDI;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	er.encoded = 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	if(flags & XER_F_CANONICAL) {
		char *scend = scratch + (sizeof(scratch) - 2);
		for(; buf < end; buf++) {
			if(p >= scend) {
				ASN__CALLBACK(scratch, p - scratch);
				er.encoded += p - scratch;
				p = scratch;
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
		}

		ASN__CALLBACK(scratch, p-scratch);	/* Dump the rest */
		er.encoded += p - scratch;
	} else {
		for(i = 0; buf < end; buf++, i++) {
			if(!(i % 16) && (i || st->size > 16)) {
				ASN__CALLBACK(scratch, p-scratch);
				er.encoded += (p-scratch);
				p = scratch;
				ASN__TEXT_INDENT(1, ilevel);
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
			*p++ = 0x20;
		}
		if(p - scratch) {
			p--;	/* Remove the tail space */
			ASN__CALLBACK(scratch, p-scratch); /* Dump the rest */
			er.encoded += p - scratch;
			if(st->size > 16)
				ASN__TEXT_INDENT(1, ilevel-1);
		}
	}

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}